

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O3

uint64_t __thiscall
Imf_3_4::Compressor::runEncodeStep
          (Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  exr_encode_pipeline_t *peVar1;
  element_type p_Var2;
  int iVar3;
  ArgExc *this_00;
  exr_chunk_info_t cinfo;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (inSize == 0) {
    *outPtr = inPtr;
    return 0;
  }
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  iVar3 = exr_chunk_default_initialize
                    (*(this->_ctxt)._ctxt.
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0
                     ,range,this->_levelX,this->_levelY);
  if (iVar3 == 0) {
    local_58._0_7_ = CONCAT16((char)this->_store_type,(undefined6)local_58);
    p_Var2 = *(this->_ctxt)._ctxt.
              super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1 = &this->_encoder;
    if (this->_encoder_init == false) {
      iVar3 = exr_encoding_initialize(p_Var2,0,&local_68,peVar1);
      if (iVar3 != 0) {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,"Unable to initialize encoder type");
        goto LAB_0015ec5f;
      }
      this->_encoder_init = true;
    }
    else {
      iVar3 = exr_encoding_update(p_Var2,0,&local_68,peVar1);
      if (iVar3 != 0) {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,"Unable to update encoder type");
        goto LAB_0015ec5f;
      }
    }
    (this->_encoder).packed_buffer = inPtr;
    (this->_encoder).packed_bytes = (long)inSize;
    iVar3 = exr_compress_chunk(peVar1);
    if (iVar3 == 0) {
      *outPtr = (char *)(this->_encoder).compressed_buffer;
      (this->_encoder).packed_buffer = (void *)0x0;
      (this->_encoder).packed_bytes = 0;
      return (this->_encoder).compressed_bytes;
    }
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,"Unable to run compression routine");
  }
  else {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,"Unable to initialize chunk information");
  }
LAB_0015ec5f:
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

uint64_t
Compressor::runEncodeStep (
    const char* inPtr,
    int inSize,
    IMATH_NAMESPACE::Box2i range,
    const char*& outPtr)
{
    // special case
    if (inSize == 0)
    {
        outPtr = inPtr;
        return 0;
    }

    exr_chunk_info_t cinfo = {0};

    if (EXR_ERR_SUCCESS != exr_chunk_default_initialize (
            _ctxt, 0, (const exr_attr_box2i_t*) &range, _levelX, _levelY, &cinfo))
        throw IEX_NAMESPACE::ArgExc ("Unable to initialize chunk information");

    cinfo.type = _store_type;
    if (!_encoder_init)
    {
        if (EXR_ERR_SUCCESS != exr_encoding_initialize(_ctxt, 0, &cinfo, &_encoder))
            throw IEX_NAMESPACE::ArgExc ("Unable to initialize encoder type");

        _encoder_init = true;
    }
    else
    {
        if (EXR_ERR_SUCCESS != exr_encoding_update(_ctxt, 0, &cinfo, &_encoder))
            throw IEX_NAMESPACE::ArgExc ("Unable to update encoder type");
    }

    _encoder.packed_buffer = const_cast<char*> (inPtr);
    _encoder.packed_bytes = inSize;

    if (EXR_ERR_SUCCESS != exr_compress_chunk(&_encoder))
        throw IEX_NAMESPACE::ArgExc ("Unable to run compression routine");

    outPtr = (const char*) _encoder.compressed_buffer;

    _encoder.packed_buffer = nullptr;
    _encoder.packed_bytes = 0;

    return _encoder.compressed_bytes;
}